

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::CordzHandle::Delete(CordzHandle *handle)

{
  bool bVar1;
  __pointer_type pCVar2;
  CordzHandle *dq_tail;
  MutexLock lock;
  Queue *queue;
  CordzHandle *handle_local;
  
  if (handle == (CordzHandle *)0x0) {
    __assert_fail("handle",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cordz_handle.cc"
                  ,0x66,"static void absl::cord_internal::CordzHandle::Delete(CordzHandle *)");
  }
  if (handle != (CordzHandle *)0x0) {
    lock.mu_ = &anon_unknown_0::GlobalQueue()->mutex;
    bVar1 = SafeToDelete(handle);
    if (!bVar1) {
      MutexLock::MutexLock((MutexLock *)&dq_tail,lock.mu_);
      pCVar2 = std::atomic<absl::lts_20250127::cord_internal::CordzHandle_*>::load
                         ((atomic<absl::lts_20250127::cord_internal::CordzHandle_*> *)(lock.mu_ + 1)
                          ,memory_order_acquire);
      if (pCVar2 != (__pointer_type)0x0) {
        handle->dq_prev_ = pCVar2;
        pCVar2->dq_next_ = handle;
        std::atomic<absl::lts_20250127::cord_internal::CordzHandle_*>::store
                  ((atomic<absl::lts_20250127::cord_internal::CordzHandle_*> *)(lock.mu_ + 1),handle
                   ,memory_order_release);
      }
      MutexLock::~MutexLock((MutexLock *)&dq_tail);
      if (pCVar2 != (__pointer_type)0x0) {
        return;
      }
    }
    if (handle != (CordzHandle *)0x0) {
      (*handle->_vptr_CordzHandle[1])();
    }
  }
  return;
}

Assistant:

void CordzHandle::Delete(CordzHandle* handle) {
  assert(handle);
  if (handle) {
    Queue& queue = GlobalQueue();
    if (!handle->SafeToDelete()) {
      MutexLock lock(&queue.mutex);
      CordzHandle* dq_tail = queue.dq_tail.load(std::memory_order_acquire);
      if (dq_tail != nullptr) {
        handle->dq_prev_ = dq_tail;
        dq_tail->dq_next_ = handle;
        queue.dq_tail.store(handle, std::memory_order_release);
        return;
      }
    }
    delete handle;
  }
}